

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyShader
               (NegativeTestContext *ctx,ShaderType shaderType,string *shaderSource)

{
  ostringstream *this;
  TestLog *log;
  allocator<char> local_21d;
  int length;
  char *source;
  Shader shader;
  MessageBuilder local_1a8;
  
  log = (ctx->super_CallLogWrapper).m_log;
  source = (shaderSource->_M_dataplus)._M_p;
  length = (int)shaderSource->_M_string_length;
  glu::Shader::Shader(&shader,ctx->m_renderCtx,shaderType);
  glu::Shader::setSources(&shader,1,&source,&length);
  glu::Shader::compile(&shader);
  glu::operator<<(log,&shader);
  if (shader.m_info.compileOk == true) {
    this = &local_1a8.m_str;
    local_1a8.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"Expected shader to fail, but compilation passed.");
    tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"Shader was not expected to compile.\n",&local_21d);
    NegativeTestContext::fail(ctx,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  glu::Shader::~Shader(&shader);
  return;
}

Assistant:

void verifyShader (NegativeTestContext& ctx, glu::ShaderType shaderType, std::string shaderSource)
{
	tcu::TestLog&	log		= ctx.getLog();
	const char*		source	= shaderSource.c_str();
	const int		length	= (int) shaderSource.size();
	glu::Shader		shader	(ctx.getRenderContext(), shaderType);

	shader.setSources(1, &source, &length);
	shader.compile();

	log << shader;
	if (shader.getCompileStatus())
	{
		log << tcu::TestLog::Message << "Expected shader to fail, but compilation passed." << tcu::TestLog::EndMessage;
		ctx.fail("Shader was not expected to compile.\n");
	}
}